

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O1

ion_bpp_err_t b_delete(ion_bpp_handle_t handle,void *key,ion_bpp_external_address_t *rec)

{
  ushort *puVar1;
  undefined4 *puVar2;
  ion_bpp_node_t *piVar3;
  void *__dest;
  int iVar4;
  ion_bpp_err_t iVar5;
  uint uVar6;
  ion_bpp_h_node_t *h;
  bool bVar7;
  int iVar8;
  ion_bpp_address_t iVar9;
  ion_bpp_node_t **ppiVar10;
  ulong uVar11;
  ion_bpp_buffer_t *buf;
  ion_bpp_key_t *mkey;
  ion_bpp_buffer_t *cbuf;
  ion_bpp_buffer_t *tmp [4];
  ion_bpp_err_t local_9c;
  int local_98;
  undefined4 uStack_94;
  ion_bpp_buffer_t *local_90;
  uint local_84;
  ulong local_80;
  uint local_74;
  void *local_70;
  ion_bpp_buffer_t *local_68;
  ion_bpp_address_t local_60;
  ion_bpp_buffer_t *local_58 [5];
  
  buf = (ion_bpp_buffer_t *)((long)handle + 0x20);
  ppiVar10 = (ion_bpp_node_t **)((long)handle + 0x38);
  local_80 = 0;
  local_70 = key;
  if ((**(byte **)((long)handle + 0x38) & 1) == 0) {
    local_84 = 0;
    local_68 = buf;
    do {
      iVar4 = search(handle,buf,local_70,*rec,(ion_bpp_key_t **)&local_98,MODE_MATCH);
      if (iVar4 < 0) {
        iVar9 = *(ion_bpp_address_t *)(CONCAT44(uStack_94,local_98) + -8);
      }
      else {
        iVar9 = *(ion_bpp_address_t *)
                 (CONCAT44(uStack_94,local_98) + 8 + (long)*(int *)((long)handle + 8));
      }
      iVar5 = readDisk(handle,iVar9,&local_90);
      if (iVar5 == bErrOk) {
        if (*(uint *)((long)handle + 0xb8) >> 1 == (uint)(*(ushort *)local_90->p >> 1)) {
          iVar5 = gather(handle,buf,(ion_bpp_key_t **)&local_98,local_58);
          bVar7 = true;
          if (iVar5 != bErrOk) goto LAB_0010b299;
          if ((buf == local_68) && ((**(ushort **)((long)handle + 0x38) & 0xfffe) == 4)) {
            uVar6 = (uint)(**(ushort **)((long)handle + 0x98) >> 1);
            if ((uint)(*(int *)((long)handle + 0xb8) * 9) >> 2 <= uVar6) goto LAB_0010b38b;
            memcpy(*(ushort **)((long)handle + 0x38) + 0x10,*(ushort **)((long)handle + 0x98) + 0x10
                   ,(ulong)uVar6 * (long)*(int *)((long)handle + 0xbc));
            puVar1 = *(ushort **)((long)handle + 0x38);
            puVar2 = *(undefined4 **)((long)handle + 0x98);
            *(undefined8 *)(puVar1 + 0xc) = *(undefined8 *)(puVar2 + 6);
            *puVar1 = *puVar1 & 1 | (ushort)*puVar2 & 0xfffe;
            **(ushort **)((long)handle + 0x38) =
                 (ushort)*(undefined4 *)*(ushort **)((long)handle + 0x38) & 0xfffe |
                 **(ushort **)((long)handle + 0x98) & 1;
            nNodesDel = nNodesDel + 3;
            bVar7 = false;
            iVar5 = local_9c;
          }
          else {
LAB_0010b38b:
            iVar5 = scatter(handle,buf,(ion_bpp_key_t *)CONCAT44(uStack_94,local_98),3,local_58);
            if (iVar5 == bErrOk) {
              iVar4 = search(handle,buf,local_70,*rec,(ion_bpp_key_t **)&local_98,MODE_MATCH);
              if (iVar4 < 0) {
                iVar9 = *(ion_bpp_address_t *)(CONCAT44(uStack_94,local_98) + -8);
              }
              else {
                iVar9 = *(ion_bpp_address_t *)
                         (CONCAT44(uStack_94,local_98) + 8 + (long)*(int *)((long)handle + 8));
              }
              iVar5 = readDisk(handle,iVar9,&local_90);
              if (iVar5 != bErrOk) goto LAB_0010b299;
              goto LAB_0010b401;
            }
          }
        }
        else {
LAB_0010b401:
          if ((iVar4 < 0) && ((undefined1 *)CONCAT44(uStack_94,local_98) == &(*ppiVar10)->fkey)) {
            local_80 = local_80 & 0xffffffff;
            if (local_84 != 0) {
              local_80 = 1;
            }
            local_84 = (uint)(local_84 != 0);
          }
          else {
            local_60 = buf->adr;
            local_74 = (local_98 - *(int *)ppiVar10) - 0x20;
            local_80 = 0;
            local_84 = 1;
            if (iVar4 < 0) {
              local_74 = local_74 - *(int *)((long)handle + 0xbc);
            }
          }
          bVar7 = false;
          buf = local_90;
          iVar5 = local_9c;
        }
      }
      else {
LAB_0010b299:
        bVar7 = true;
      }
      local_9c = iVar5;
      if (bVar7) {
        return local_9c;
      }
      ppiVar10 = &buf->p;
    } while ((undefined1  [40])((undefined1  [40])*buf->p & (undefined1  [40])0x1) ==
             (undefined1  [40])0x0);
    local_80 = CONCAT71((int7)((ulong)buf->p >> 8),(int)local_80 != 0);
    uVar11 = (ulong)local_74;
  }
  else {
    uVar11 = 0;
  }
  iVar5 = bErrKeyNotFound;
  iVar4 = search(handle,buf,local_70,*rec,(ion_bpp_key_t **)&local_98,MODE_MATCH);
  if (iVar4 == 0) {
    __dest = (void *)CONCAT44(uStack_94,local_98);
    *rec = *(ion_bpp_external_address_t *)((long)__dest + (long)*(int *)((long)handle + 8));
    iVar8 = (local_98 - (int)*ppiVar10) + -0x20;
    iVar4 = *(int *)((long)handle + 0xbc) * ((*(ushort *)*ppiVar10 >> 1) - 1) - iVar8;
    if (iVar4 != 0) {
      memmove(__dest,(void *)((long)*(int *)((long)handle + 0xbc) + (long)__dest),(long)iVar4);
    }
    *(short *)*ppiVar10 = *(short *)*ppiVar10 + -2;
    buf->valid = boolean_true;
    buf->modified = boolean_true;
    if ((iVar8 == 0 & (byte)local_80) == 1) {
      iVar5 = readDisk(handle,local_60,&local_90);
      if (iVar5 != bErrOk) {
        return iVar5;
      }
      piVar3 = local_90->p;
      memcpy(&piVar3->fkey + uVar11,__dest,(long)*(int *)((long)handle + 8));
      *(undefined8 *)(&piVar3->fkey + (long)*(int *)((long)handle + 8) + uVar11) =
           *(undefined8 *)((long)__dest + (long)*(int *)((long)handle + 8));
      local_90->valid = boolean_true;
      local_90->modified = boolean_true;
    }
    nKeysDel = nKeysDel + 1;
    iVar5 = bErrOk;
  }
  return iVar5;
}

Assistant:

ion_bpp_err_t
b_delete(
	ion_bpp_handle_t			handle,
	void						*key,
	ion_bpp_external_address_t	*rec
) {
	int					rc;		/* return code */
	ion_bpp_key_t		*mkey;			/* match key */
	int					len;	/* length to shift */
	int					cc;		/* condition code */
	ion_bpp_buffer_t	*buf;				/* buffer */
	ion_bpp_buffer_t	*tmp[4];
	unsigned int		keyOff;
	ion_bpp_bool_t		lastGEvalid;		/* true if GE branch taken */
	ion_bpp_bool_t		lastLTvalid;		/* true if LT branch taken after GE branch */
	ion_bpp_address_t	lastGE;			/* last childGE traversed */
	unsigned int		lastGEkey;	/* last childGE key traversed */
	ion_bpp_buffer_t	*root;
	ion_bpp_buffer_t	*gbuf;

	ion_bpp_h_node_t *h = handle;

	root		= &h->root;
	gbuf		= &h->gbuf;
	lastGEvalid = boolean_false;
	lastLTvalid = boolean_false;

	buf			= root;

	while (1) {
		if (leaf(buf)) {
			/* set mkey to point to deletion point */
			if (search(handle, buf, key, *rec, &mkey, MODE_MATCH) == 0) {
				*rec = rec(mkey);
			}
			else {
				return bErrKeyNotFound;
			}

			/* shift items GT key to left */
			keyOff	= mkey - fkey(buf);
			len		= ks(ct(buf) - 1) - keyOff;

			if (len) {
				memmove(mkey, mkey + ks(1), len);
			}

			ct(buf)--;

			if ((rc = writeDisk(buf)) != 0) {
				return rc;
			}

			/* if deleted key is first key, then fixup lastGE key */
			if (!keyOff && lastLTvalid) {
				ion_bpp_buffer_t	*tbuf;
				ion_bpp_key_t		*tkey;

				if ((rc = readDisk(handle, lastGE, &tbuf)) != 0) {
					return rc;
				}

				tkey		= fkey(tbuf) + lastGEkey;
				memcpy(key(tkey), mkey, h->keySize);
				rec(tkey)	= rec(mkey);

				if ((rc = writeDisk(tbuf)) != 0) {
					return rc;
				}
			}

			nKeysDel++;
			break;
		}
		else {
			/* internal node, descend to child */
			ion_bpp_buffer_t *cbuf;	/* child buf */

			/* read child */
			if ((cc = search(handle, buf, key, *rec, &mkey, MODE_MATCH)) < 0) {
				if ((rc = readDisk(handle, childLT(mkey), &cbuf)) != 0) {
					return rc;
				}
			}
			else {
				if ((rc = readDisk(handle, childGE(mkey), &cbuf)) != 0) {
					return rc;
				}
			}

			/* check for room to delete */
			if (ct(cbuf) == h->maxCt / 2) {
				/* gather 3 bufs and scatter */
				if ((rc = gather(handle, buf, &mkey, tmp)) != 0) {
					return rc;
				}

				/* if last 3 bufs in root, and count is low enough... */
				if ((buf == root) && (ct(root) == 2) && (ct(gbuf) < (3 * (3 * h->maxCt)) / 4)) {
					/* collapse tree by one level */
					scatterRoot(handle);
					nNodesDel += 3;
					continue;
				}

				if ((rc = scatter(handle, buf, mkey, 3, tmp)) != 0) {
					return rc;
				}

				/* read child */
				if ((cc = search(handle, buf, key, *rec, &mkey, MODE_MATCH)) < 0) {
					if ((rc = readDisk(handle, childLT(mkey), &cbuf)) != 0) {
						return rc;
					}
				}
				else {
					if ((rc = readDisk(handle, childGE(mkey), &cbuf)) != 0) {
						return rc;
					}
				}
			}

			if ((cc >= 0) || (mkey != fkey(buf))) {
				lastGEvalid = boolean_true;
				lastLTvalid = boolean_false;
				lastGE		= buf->adr;
				lastGEkey	= mkey - fkey(buf);

				if (cc < 0) {
					lastGEkey -= ks(1);
				}
			}
			else {
				if (lastGEvalid) {
					lastLTvalid = boolean_true;
				}
			}

			buf = cbuf;
		}
	}

	return bErrOk;
}